

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# translate.c
# Opt level: O2

_Bool op_par_addsub(DisasContext_conflict1 *s,arg_rrr *a,
                   _func_void_TCGContext_ptr_TCGv_i32_TCGv_i32_TCGv_i32_conflict1 *gen)

{
  TCGContext_conflict1 *s_00;
  ulong uVar1;
  TCGv_i32 var;
  TCGv_i32 pTVar2;
  uintptr_t o;
  
  s_00 = s->uc->tcg_ctx;
  if (s->thumb == 0) {
    uVar1 = s->features & 8;
  }
  else {
    uVar1 = s->features >> 0x22 & 1;
  }
  if (uVar1 != 0) {
    var = load_reg(s,a->rn);
    pTVar2 = load_reg(s,a->rm);
    (*gen)(s_00,var,var,pTVar2);
    tcg_temp_free_internal_aarch64(s_00,(TCGTemp *)(pTVar2 + (long)s_00));
    store_reg(s,a->rd,var);
  }
  return uVar1 != 0;
}

Assistant:

static bool op_par_addsub(DisasContext *s, arg_rrr *a,
                          void (*gen)(TCGContext *, TCGv_i32, TCGv_i32, TCGv_i32))
{
    TCGContext *tcg_ctx = s->uc->tcg_ctx;
    TCGv_i32 t0, t1;

    if (s->thumb
        ? !arm_dc_feature(s, ARM_FEATURE_THUMB_DSP)
        : !ENABLE_ARCH_6) {
        return false;
    }

    t0 = load_reg(s, a->rn);
    t1 = load_reg(s, a->rm);

    gen(tcg_ctx, t0, t0, t1);

    tcg_temp_free_i32(tcg_ctx, t1);
    store_reg(s, a->rd, t0);
    return true;
}